

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O2

bool __thiscall
QCss::ValueExtractor::extractBackground
          (ValueExtractor *this,QBrush *brush,QString *image,Repeat *repeat,Alignment *alignment,
          Origin *origin,Attachment *attachment,Origin *clip)

{
  QPalette *pal;
  Property PVar1;
  long lVar2;
  Declaration *pDVar3;
  DeclarationData *pDVar4;
  _Head_base<0UL,_QBrushData_*,_false> _Var5;
  Data *pDVar6;
  QPalettePrivate *pQVar7;
  DataPtr DVar8;
  char16_t *pcVar9;
  undefined8 uVar10;
  Repeat RVar11;
  QFlagsStorage<Qt::AlignmentFlag> QVar12;
  quint64 qVar13;
  Alignment *pAVar14;
  ulong uVar15;
  int iVar16;
  long lVar17;
  QPalette *pal_00;
  long lVar18;
  int iVar19;
  long in_FS_OFFSET;
  bool bVar20;
  undefined1 local_98 [12];
  anon_enum_32 aStack_8c;
  anon_union_24_3_e3d07ef4_for_data local_88;
  BackgroundData data;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar15 = 0;
  bVar20 = false;
  do {
    if ((ulong)(this->declarations).d.size <= uVar15) {
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
        __stack_chk_fail();
      }
      return bVar20;
    }
    pDVar3 = (this->declarations).d.ptr;
    pDVar4 = pDVar3[uVar15].d.d.ptr;
    if ((pDVar4->values).d.size == 0) goto LAB_00541698;
    pal = (QPalette *)(pDVar3 + uVar15);
    PVar1 = pDVar4->propertyId;
    if (6 < PVar1 - Background) {
      if (PVar1 != BackgroundColor) goto LAB_00541698;
      QPalette::QPalette((QPalette *)&data);
      Declaration::brushValue((Declaration *)&local_88.shared,pal);
      _Var5._M_head_impl =
           (brush->d)._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
           super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
           super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl;
      (brush->d)._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
      super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
      super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = (QBrushData *)local_88.shared;
      local_88.shared = (PrivateShared *)_Var5._M_head_impl;
      QBrush::~QBrush((QBrush *)&local_88.shared);
      QPalette::~QPalette((QPalette *)&data);
      goto LAB_005411e8;
    }
    switch(PVar1) {
    case Background:
      if (*(ulong *)&(pDVar4->parsed).d.field_0x18 < 4) {
        local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        stack0xffffffffffffff70 = &DAT_aaaaaaaaaaaaaaaa;
        BrushData::BrushData((BrushData *)local_98);
        pQVar7 = pal->d;
        BrushData::BrushData(&data.brush);
        uVar10 = local_98._0_8_;
        local_98._0_8_ =
             data.brush.brush.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>.
             _M_t.super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
             super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl;
        local_98._8_4_ = data.brush.role;
        aStack_8c = data.brush.type;
        data.brush.brush.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
        super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
        super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = (DataPtr)(DataPtr)uVar10;
        QBrush::~QBrush((QBrush *)&data);
        data.brush.brush.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
        super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
        super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = (DataPtr)(image->d).d;
        data.brush._8_8_ = (image->d).ptr;
        (image->d).d = (Data *)0x0;
        (image->d).ptr = (char16_t *)0x0;
        data.image.d.d = (Data *)(image->d).size;
        (image->d).size = 0;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&data);
        *repeat = Repeat_XY;
        (alignment->super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>).
        super_QFlagsStorage<Qt::AlignmentFlag>.i = 0x21;
        for (iVar16 = 0; lVar18 = (long)iVar16, lVar18 < (long)pQVar7[1].data.d.ptr;
            iVar16 = iVar16 + 1) {
          lVar17 = lVar18 * 0x28;
          iVar19 = *(int *)(*(long *)&pQVar7[1].detach_no + lVar17);
          pal_00 = (QPalette *)(*(long *)&pQVar7[1].detach_no + lVar17);
          if (iVar19 == 6) {
            iVar19 = ::QVariant::toInt((bool *)&pal_00->currentGroup);
            if (iVar19 == 0x27) {
              data.brush.brush.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>.
              _M_t.super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
              super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = (DataPtr)(image->d).d;
              data.brush._8_8_ = (image->d).ptr;
              (image->d).d = (Data *)0x0;
              (image->d).ptr = (char16_t *)0x0;
              data.image.d.d = (Data *)(image->d).size;
              (image->d).size = 0;
              goto LAB_0054141a;
            }
            if ((*(int *)&pal_00->d == 6) &&
               (iVar19 = ::QVariant::toInt((bool *)&pal_00->currentGroup), iVar19 == 0x28)) {
              QBrush::QBrush((QBrush *)&local_88.shared,transparent,SolidPattern);
              BrushData::BrushData(&data.brush,(QBrush *)&local_88.shared);
              uVar10 = local_98._0_8_;
              local_98._0_8_ =
                   data.brush.brush.d._M_t.
                   super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                   super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                   super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl;
              local_98._8_4_ = data.brush.role;
              aStack_8c = data.brush.type;
              data.brush.brush.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>.
              _M_t.super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
              super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = (DataPtr)(DataPtr)uVar10;
              QBrush::~QBrush((QBrush *)&data);
              QBrush::~QBrush((QBrush *)&local_88.shared);
            }
LAB_0054148a:
            ::QVariant::toString();
            qVar13 = findKnownValue((QString *)&data,repeats,5);
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&data);
            if ((Repeat)qVar13 == Repeat_Unknown) {
              if (*(int *)&pal_00->d == 6) {
                if (lVar18 < (long)&pQVar7[1].data.d.ptr[-1].field_0x21f) {
                  bVar20 = *(int *)(*(long *)&pQVar7[1].detach_no + (long)(iVar16 + 1) * 0x28) == 6;
                  iVar19 = iVar16 + 1;
                  if (!bVar20) {
                    iVar19 = iVar16;
                  }
                  iVar16 = iVar19;
                  iVar19 = bVar20 + 1;
                }
                else {
                  iVar19 = 1;
                }
                QVar12.i = (Int)parseAlignment((Value *)(*(long *)&pQVar7[1].detach_no + lVar17),
                                               iVar19);
                if ((QFlagsStorage<Qt::AlignmentFlag>)QVar12.i !=
                    (QFlagsStorage<Qt::AlignmentFlag>)0x0) {
                  (alignment->super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>).
                  super_QFlagsStorage<Qt::AlignmentFlag>.i = QVar12.i;
                  goto LAB_00541566;
                }
                iVar16 = (iVar16 - iVar19) + 1;
              }
              parseBrushValue((Value *)&data,pal_00);
              uVar10 = local_98._0_8_;
              local_98._0_8_ =
                   data.brush.brush.d._M_t.
                   super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                   super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                   super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl;
              local_98._8_4_ = data.brush.role;
              aStack_8c = data.brush.type;
              data.brush.brush.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>.
              _M_t.super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
              super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = (DataPtr)(DataPtr)uVar10;
              QBrush::~QBrush((QBrush *)&data);
            }
            else {
              *repeat = (Repeat)qVar13;
            }
          }
          else {
            if (iVar19 != 7) goto LAB_0054148a;
            ::QVariant::toString();
            DVar8._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
            super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
            super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl =
                 (__uniq_ptr_data<QBrushData,_QBrushDataPointerDeleter,_true,_true>)(image->d).d;
            pcVar9 = (image->d).ptr;
            (image->d).d = (Data *)data.brush.brush.d._M_t.
                                   super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                                   super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                                   super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl;
            (image->d).ptr = (char16_t *)data.brush._8_8_;
            pDVar6 = (Data *)(image->d).size;
            (image->d).size = (qsizetype)data.image.d.d;
            data.brush.brush.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t
            .super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
            super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl =
                 (DataPtr)(DataPtr)DVar8._M_t.
                                   super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                                   super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                                   super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl;
            data.brush._8_8_ = pcVar9;
            data.image.d.d = pDVar6;
LAB_0054141a:
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&data);
          }
LAB_00541566:
        }
        brushFromData(&data.brush,(QPalette *)local_98);
        _Var5._M_head_impl =
             (brush->d)._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
             super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
             super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl;
        (brush->d)._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
        super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
        super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = (QBrushData *)data.brush.brush;
        data.brush.brush.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
        super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
        super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl =
             (DataPtr)(DataPtr)_Var5._M_head_impl;
        QBrush::~QBrush((QBrush *)&data);
        if (aStack_8c != DependsOnThePalette) {
          data.image.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          data._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
          data.image.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          data.image.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          data.brush.brush.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
          super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
          super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = (DataPtr)&DAT_aaaaaaaaaaaaaaaa;
          data.brush._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          BrushData::BrushData(&data.brush,(BrushData *)local_98);
          data.image.d.d = (image->d).d;
          data.image.d.ptr = (image->d).ptr;
          data.image.d.size = (image->d).size;
          if (data.image.d.d != (Data *)0x0) {
            LOCK();
            ((data.image.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((data.image.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 1;
            UNLOCK();
          }
          data.alignment.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
          super_QFlagsStorage<Qt::AlignmentFlag>.i =
               (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
               (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
               (alignment->super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>).
               super_QFlagsStorage<Qt::AlignmentFlag>.i;
          data.repeat = *repeat;
          ::QVariant::fromValue<QCss::BackgroundData>
                    ((enable_if_t<std::is_copy_constructible_v<QCss::BackgroundData>_&&_std::is_destructible_v<QCss::BackgroundData>,_QVariant>
                      *)&local_88,&data);
          ::QVariant::operator=((QVariant *)(pal->d + 2),(QVariant *)&local_88);
          ::QVariant::~QVariant((QVariant *)&local_88);
          BackgroundData::~BackgroundData(&data);
        }
        QBrush::~QBrush((QBrush *)local_98);
        bVar20 = true;
      }
      else {
        data.image.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        data._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
        data.image.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        data.image.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        data.brush.brush.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
        super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
        super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = (DataPtr)&DAT_aaaaaaaaaaaaaaaa;
        data.brush._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        qvariant_cast<QCss::BackgroundData>(&data,(QVariant *)(pal->d + 2));
        brushFromData((BrushData *)&local_88,(QPalette *)&data);
        _Var5._M_head_impl =
             (brush->d)._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
             super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
             super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl;
        (brush->d)._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
        super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
        super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = (QBrushData *)local_88.shared;
        local_88.shared = (PrivateShared *)_Var5._M_head_impl;
        QBrush::~QBrush((QBrush *)&local_88.shared);
        QString::operator=(image,(QString *)&data.image);
        *repeat = data.repeat;
        (alignment->super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>).
        super_QFlagsStorage<Qt::AlignmentFlag>.i = (Int)data.alignment;
        BackgroundData::~BackgroundData(&data);
        bVar20 = true;
      }
      goto LAB_00541698;
    case BackgroundOrigin:
      QVar12.i = Declaration::originValue((Declaration *)pal);
      pAVar14 = (Alignment *)origin;
      break;
    case BackgroundClip:
      QVar12.i = Declaration::originValue((Declaration *)pal);
      pAVar14 = (Alignment *)clip;
      break;
    case BackgroundRepeat:
      if (*(ulong *)&(pDVar4->parsed).d.field_0x18 < 4) {
        ::QVariant::toString();
        qVar13 = findKnownValue((QString *)&data,repeats,5);
        *repeat = (Repeat)qVar13;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&data);
        ::QVariant::QVariant((QVariant *)&data,*repeat);
        ::QVariant::operator=((QVariant *)(pal->d + 2),(QVariant *)&data);
        ::QVariant::~QVariant((QVariant *)&data);
      }
      else {
        RVar11 = ::QVariant::toInt((bool *)&pDVar4->parsed);
        *repeat = RVar11;
      }
LAB_005412b8:
      bVar20 = true;
      goto LAB_00541698;
    case BackgroundPosition:
      QVar12.i = (Int)Declaration::alignmentValue((Declaration *)pal);
      pAVar14 = alignment;
      break;
    case BackgroundAttachment:
      QVar12.i = Declaration::attachmentValue((Declaration *)pal);
      pAVar14 = (Alignment *)attachment;
      break;
    case BackgroundImage:
      bVar20 = true;
      if (((pDVar4->values).d.ptr)->type == Uri) {
        ::QVariant::toString();
        DVar8._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
        super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
        super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl =
             (__uniq_ptr_data<QBrushData,_QBrushDataPointerDeleter,_true,_true>)(image->d).d;
        pcVar9 = (image->d).ptr;
        (image->d).d = (Data *)data.brush.brush.d._M_t.
                               super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                               super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                               super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl;
        (image->d).ptr = (char16_t *)data.brush._8_8_;
        pDVar6 = (Data *)(image->d).size;
        (image->d).size = (qsizetype)data.image.d.d;
        data.brush.brush.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
        super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
        super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl =
             (DataPtr)(DataPtr)DVar8._M_t.
                               super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                               super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                               super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl;
        data.brush._8_8_ = pcVar9;
        data.image.d.d = pDVar6;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&data);
        goto LAB_005412b8;
      }
      goto LAB_00541698;
    }
    (pAVar14->super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>).
    super_QFlagsStorage<Qt::AlignmentFlag>.i = QVar12.i;
LAB_005411e8:
    bVar20 = true;
LAB_00541698:
    uVar15 = uVar15 + 1;
  } while( true );
}

Assistant:

bool ValueExtractor::extractBackground(QBrush *brush, QString *image, Repeat *repeat,
                                       Qt::Alignment *alignment, Origin *origin, Attachment *attachment,
                                       Origin *clip)
{
    bool hit = false;
    for (int i = 0; i < declarations.size(); ++i) {
        const Declaration &decl = declarations.at(i);
        if (decl.d->values.isEmpty())
            continue;
        const QCss::Value &val = decl.d->values.at(0);
        switch (decl.d->propertyId) {
            case BackgroundColor:
                    *brush = decl.brushValue();
                break;
            case BackgroundImage:
                if (val.type == Value::Uri)
                    *image = val.variant.toString();
                break;
            case BackgroundRepeat:
                if (decl.d->parsed.isValid()) {
                    *repeat = static_cast<Repeat>(decl.d->parsed.toInt());
                } else {
                    *repeat = static_cast<Repeat>(findKnownValue(val.variant.toString(),
                                                  repeats, NumKnownRepeats));
                    decl.d->parsed = *repeat;
                }
                break;
            case BackgroundPosition:
                *alignment = decl.alignmentValue();
                break;
            case BackgroundOrigin:
                *origin = decl.originValue();
                break;
            case BackgroundClip:
                *clip = decl.originValue();
                break;
            case Background:
                if (decl.d->parsed.isValid()) {
                    BackgroundData data = qvariant_cast<BackgroundData>(decl.d->parsed);
                    *brush = brushFromData(data.brush, pal);
                    *image = data.image;
                    *repeat = data.repeat;
                    *alignment = data.alignment;
                } else {
                    BrushData brushData;
                    parseShorthandBackgroundProperty(decl.d->values, &brushData, image, repeat, alignment, pal);
                    *brush = brushFromData(brushData, pal);
                    if (brushData.type != BrushData::DependsOnThePalette) {
                        BackgroundData data = { brushData, *image, *repeat, *alignment };
                        decl.d->parsed = QVariant::fromValue<BackgroundData>(data);
                    }
                }
                break;
            case BackgroundAttachment:
                *attachment = decl.attachmentValue();
                break;
            default: continue;
        }
        hit = true;
    }
    return hit;
}